

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_column_data.cpp
# Opt level: O2

bool __thiscall duckdb::ArrayColumnData::IsPersistent(ArrayColumnData *this)

{
  bool bVar1;
  int iVar2;
  pointer pCVar3;
  
  bVar1 = ColumnData::IsPersistent(&(this->validity).super_ColumnData);
  if (bVar1) {
    pCVar3 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
             operator->(&this->child_column);
    iVar2 = (*pCVar3->_vptr_ColumnData[0x1e])(pCVar3);
    return SUB41(iVar2,0);
  }
  return false;
}

Assistant:

bool ArrayColumnData::IsPersistent() {
	return validity.IsPersistent() && child_column->IsPersistent();
}